

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O0

QPoint QHighDpi::fromNativeLocalPosition<QPoint,QWindow>(QPoint *value,QWindow *context)

{
  long lVar1;
  QPoint QVar2;
  QWindow *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  qreal qVar3;
  QPoint *pos;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QPoint in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QHighDpiScaling::factor<QWindow_const>(in_RSI);
  pos = (QPoint *)(1.0 / qVar3);
  QPoint::QPoint(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  QVar2 = scale(pos,(qreal)in_RDI,in_stack_ffffffffffffffe8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

T fromNativeLocalPosition(const T &value, const C *context)
{
    return scale(value, qreal(1) / QHighDpiScaling::factor(context));
}